

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred,uint16_t *out)

{
  unsigned_short *puVar1;
  SSL *ssl;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  unsigned_short *puVar7;
  size_t sVar8;
  int line;
  unsigned_short *puVar9;
  long lVar10;
  uint16_t sigalg;
  uint16_t local_4a;
  uint16_t *local_48;
  uint16_t *local_40;
  SSL *local_38;
  
  ssl = hs->ssl;
  local_48 = out;
  bVar2 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar2) {
    uVar4 = ssl_protocol_version(ssl);
    if (uVar4 < 0x303) {
      iVar5 = EVP_PKEY_id((EVP_PKEY *)
                          (cred->pubkey)._M_t.
                          super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
      if (iVar5 == 0x198) {
        *local_48 = 0x203;
      }
      else {
        if (iVar5 != 6) {
          bVar2 = false;
          iVar5 = 0xfd;
          line = 0x11ae;
          goto LAB_00138843;
        }
        *local_48 = 0xff01;
      }
      return true;
    }
    if (cred->type == kDelegated) {
      sVar6 = (hs->peer_delegated_credential_sigalgs).size_;
      local_40 = (hs->peer_delegated_credential_sigalgs).data_;
    }
    else {
      sVar8 = (hs->peer_sigalgs).size_;
      sVar6 = 2;
      if (uVar4 != 0x303 || sVar8 != 0) {
        sVar6 = sVar8;
      }
      local_40 = tls1_choose_signature_algorithm::kTLS12Default;
      if (uVar4 != 0x303 || sVar8 != 0) {
        local_40 = (hs->peer_sigalgs).data_;
      }
    }
    sVar8 = (cred->sigalgs).size_;
    if (sVar8 == 0) {
      puVar9 = &kSignSignatureAlgorithms;
      sVar8 = 0xc;
    }
    else {
      puVar9 = (cred->sigalgs).data_;
    }
    puVar1 = local_40 + sVar6;
    bVar2 = true;
    lVar10 = 0;
    local_38 = ssl;
    do {
      local_4a = *(uint16_t *)((long)puVar9 + lVar10);
      bVar3 = ssl_pkey_supports_algorithm
                        (local_38,(cred->pubkey)._M_t.
                                  super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,local_4a,
                         false);
      iVar5 = 3;
      if (bVar3) {
        puVar7 = std::
                 __find_if<unsigned_short_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                           (local_40,puVar1,&local_4a);
        if (puVar7 == puVar1) {
          iVar5 = 0;
        }
        else {
          *local_48 = local_4a;
          iVar5 = 1;
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) {
        return bVar2;
      }
      lVar10 = lVar10 + 2;
      bVar2 = sVar8 * 2 != lVar10;
    } while (bVar2);
    iVar5 = 0xfd;
    line = 0x11d2;
  }
  else {
    bVar2 = false;
    iVar5 = 0xe4;
    line = 0x11a5;
  }
LAB_00138843:
  ERR_put_error(0x10,0,iVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,line);
  return bVar2;
}

Assistant:

bool tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,
                                     const SSL_CREDENTIAL *cred,
                                     uint16_t *out) {
  SSL *const ssl = hs->ssl;
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  // Before TLS 1.2, the signature algorithm isn't negotiated as part of the
  // handshake.
  uint16_t version = ssl_protocol_version(ssl);
  if (version < TLS1_2_VERSION) {
    if (!tls1_get_legacy_signature_algorithm(out, cred->pubkey.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
      return false;
    }
    return true;
  }

  Span<const uint16_t> peer_sigalgs;
  if (cred->type == SSLCredentialType::kDelegated) {
    peer_sigalgs = hs->peer_delegated_credential_sigalgs;
  } else {
    peer_sigalgs = hs->peer_sigalgs;
    if (peer_sigalgs.empty() && version == TLS1_2_VERSION) {
      // If the client didn't specify any signature_algorithms extension, it is
      // interpreted as SHA-1. See
      // http://tools.ietf.org/html/rfc5246#section-7.4.1.4.1
      static const uint16_t kTLS12Default[] = {SSL_SIGN_RSA_PKCS1_SHA1,
                                               SSL_SIGN_ECDSA_SHA1};
      peer_sigalgs = kTLS12Default;
    }
  }

  Span<const uint16_t> sigalgs =
      cred->sigalgs.empty() ? Span(kSignSignatureAlgorithms) : cred->sigalgs;
  for (uint16_t sigalg : sigalgs) {
    if (!ssl_pkey_supports_algorithm(ssl, cred->pubkey.get(), sigalg,
                                     /*is_verify=*/false)) {
      continue;
    }

    if (std::find(peer_sigalgs.begin(), peer_sigalgs.end(), sigalg) !=
        peer_sigalgs.end()) {
      *out = sigalg;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
  return false;
}